

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

void __thiscall
ctemplate::CleanseAttribute::Modify
          (CleanseAttribute *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte bVar1;
  uint uVar2;
  size_t i;
  size_t sVar3;
  undefined8 uStack_40;
  
  sVar3 = 0;
  do {
    if (inlen == sVar3) {
      return;
    }
    bVar1 = in[sVar3];
    uVar2 = bVar1 - 0x2d;
    if (uVar2 < 0x33) {
      if ((0x4000000002003U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        if ((ulong)uVar2 != 0x10) goto LAB_0012e823;
        if (sVar3 == 0 || inlen - 1 == sVar3) {
          uStack_40 = 0x5f;
        }
        else {
          uStack_40 = 0x3d;
        }
        (*out->_vptr_ExpandEmitter[2])(out,uStack_40);
      }
      else {
        (*out->_vptr_ExpandEmitter[2])(out);
      }
    }
    else {
LAB_0012e823:
      if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
        (*out->_vptr_ExpandEmitter[2])(out,(ulong)(uint)(int)(char)bVar1);
      }
      else {
        (*out->_vptr_ExpandEmitter[5])(out,"_",1);
      }
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

void CleanseAttribute::Modify(const char* in, size_t inlen,
                              const PerExpandData*,
                              ExpandEmitter* out, const string& arg) const {
  for (size_t i = 0; i < inlen; ++i) {
    char c = in[i];
    switch (c) {
      case '=': {
        if (i == 0 || i == (inlen - 1))
          out->Emit('_');
        else
          out->Emit(c);
        break;
      }
      case '-':
      case '.':
      case '_':
      case ':': {
        out->Emit(c);
        break;
      }
      default: {
        if ((c >= 'a' && c <= 'z') ||
            (c >= 'A' && c <= 'Z') ||
            (c >= '0' && c <= '9')) {
          out->Emit(c);
        } else {
          APPEND("_");
        }
        break;
      }
    }
  }
}